

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O0

void worker(void)

{
  int iVar1;
  uint uVar2;
  _Bool _Var3;
  ulong uVar4;
  uint local_14;
  uint local_10;
  uint h;
  int work;
  int my_id;
  
  iVar1 = next_worker_id;
  local_10 = (next_worker_id * 0x11) % 0xb + 0xd;
  local_14 = 0x2a;
  uVar4 = (ulong)(uint)next_worker_id;
  next_worker_id = next_worker_id + 1;
  fprintf((FILE *)out,"[Worker %d] started, work=%d\n",uVar4,(ulong)local_10);
  while( true ) {
    uVar2 = local_10;
    _Var3 = shutting_down();
    if (!_Var3) {
      local_10 = local_10 - 1;
    }
    if (_Var3 || (int)uVar2 < 1) break;
    local_14 = ((local_10 ^ local_14) << 0xd | (local_10 ^ local_14) >> 0x13) * 0x539;
    yield();
  }
  fprintf((FILE *)out,"[Worker %d] exiting, result: %u\n",(ulong)(uint)iVar1,(ulong)local_14);
  return;
}

Assistant:

static void
worker(void)
{
    int my_id = next_worker_id++;
    int work = 13 + ((my_id * 17) % 11);
    unsigned h = 42;
    fprintf(out, "[Worker %d] started, work=%d\n", my_id, work);
    while (!shutting_down() && work-- > 0) {
        h ^= (unsigned) work;
        h = (h << 13) | (h >> 19);
        h *= 1337;
        yield();
    }
    fprintf(out, "[Worker %d] exiting, result: %u\n", my_id, h);
}